

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

int TextCopy(char *dst,char *src)

{
  long lVar1;
  
  lVar1 = 0;
  if (dst != (char *)0x0) {
    for (; src[lVar1] != '\0'; lVar1 = lVar1 + 1) {
      dst[lVar1] = src[lVar1];
    }
    dst[lVar1] = '\0';
  }
  return (int)lVar1;
}

Assistant:

int TextCopy(char *dst, const char *src)
{
    int bytes = 0;

    if (dst != NULL)
    {
        while (*src != '\0')
        {
            *dst = *src;
            dst++;
            src++;

            bytes++;
        }

        *dst = '\0';
    }

    return bytes;
}